

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

int stbi__gif_test_raw(stbi__context *s)

{
  stbi_uc sVar1;
  int sz;
  stbi__context *s_local;
  
  sVar1 = stbi__get8(s);
  if ((((sVar1 == 'G') && (sVar1 = stbi__get8(s), sVar1 == 'I')) &&
      (sVar1 = stbi__get8(s), sVar1 == 'F')) && (sVar1 = stbi__get8(s), sVar1 == '8')) {
    sVar1 = stbi__get8(s);
    if ((sVar1 != '9') && (sVar1 != '7')) {
      return 0;
    }
    sVar1 = stbi__get8(s);
    if (sVar1 != 'a') {
      return 0;
    }
    return 1;
  }
  return 0;
}

Assistant:

static int stbi__gif_test_raw(stbi__context *s)
{
   int sz;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8') return 0;
   sz = stbi__get8(s);
   if (sz != '9' && sz != '7') return 0;
   if (stbi__get8(s) != 'a') return 0;
   return 1;
}